

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calculateEdgeLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int count,double *outSumLogLikelihood,double *outSumFirstDerivative,
          double *outSumSecondDerivative)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  int scalingIndices [2];
  
  uVar1 = this->kFlags;
  if (count == 1) {
    uVar6 = 0;
    if (-1 < (char)uVar1) {
      if (((uint)uVar1 >> 8 & 1) == 0) {
        uVar6 = (ulong)(uint)*cumulativeScaleIndices;
      }
      else {
        uVar6 = (ulong)(uint)this->kInternalPartialsBufferCount;
        uVar7 = *parentBufferIndices - this->kTipCount;
        uVar5 = *childBufferIndices - this->kTipCount;
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x24])(this);
        if ((int)(uVar7 | uVar5) < 0) {
          if ((-1 < (int)uVar7) || (uVar7 = uVar5, -1 < (int)uVar5)) {
            scalingIndices[0] = uVar7;
            (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x20])(this,scalingIndices,1);
          }
        }
        else {
          scalingIndices[0] = uVar7;
          scalingIndices[1] = uVar5;
          (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x20])(this,scalingIndices,2,uVar6);
        }
      }
    }
    if (firstDerivativeIndices != (int *)0x0 || secondDerivativeIndices != (int *)0x0) {
      if (secondDerivativeIndices != (int *)0x0) {
        iVar3 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x53])(this);
        return iVar3;
      }
      iVar3 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x52])
                        (this,(ulong)(uint)*parentBufferIndices,(ulong)(uint)*childBufferIndices,
                         (ulong)(uint)*probabilityIndices,(ulong)(uint)*firstDerivativeIndices,
                         (ulong)(uint)*categoryWeightsIndices,(ulong)(uint)*stateFrequenciesIndices,
                         uVar6,outSumLogLikelihood,outSumFirstDerivative);
      return iVar3;
    }
    if (this->kAutoRootPartitioningEnabled != true) {
      iVar3 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x4c])
                        (this,(ulong)(uint)*parentBufferIndices,(ulong)(uint)*childBufferIndices,
                         (ulong)(uint)*probabilityIndices,(ulong)(uint)*categoryWeightsIndices,
                         (ulong)(uint)*stateFrequenciesIndices,uVar6,outSumLogLikelihood);
      return iVar3;
    }
    (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x4e])
              (this,parentBufferIndices,childBufferIndices,probabilityIndices,categoryWeightsIndices
               ,stateFrequenciesIndices,cumulativeScaleIndices,this->gAutoPartitionIndices,
               this->gAutoPartitionOutSumLogLikelihoods);
    *outSumLogLikelihood = 0.0;
    iVar3 = this->kPartitionCount;
    if (0 < (long)iVar3) {
      pdVar2 = this->gAutoPartitionOutSumLogLikelihoods;
      dVar8 = 0.0;
      lVar4 = 0;
      do {
        dVar8 = dVar8 + pdVar2[lVar4];
        lVar4 = lVar4 + 1;
        *outSumLogLikelihood = dVar8;
      } while (iVar3 != lVar4);
      return (uint)(!NAN(dVar8) && !NAN(dVar8)) * 8 + -8;
    }
  }
  else {
    if ((uVar1 & 0x180) != 0) {
      BeagleCPUImpl<double,1,0>::calculateEdgeLogLikelihoods();
    }
    if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
      iVar3 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x51])
                        (this,parentBufferIndices,childBufferIndices,probabilityIndices,
                         categoryWeightsIndices,stateFrequenciesIndices,cumulativeScaleIndices,
                         (ulong)(uint)count,outSumLogLikelihood);
      return iVar3;
    }
    BeagleCPUImpl<double,1,0>::calculateEdgeLogLikelihoods();
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeLogLikelihoods(const int* parentBufferIndices,
                                                             const int* childBufferIndices,
                                                             const int* probabilityIndices,
                                                             const int* firstDerivativeIndices,
                                                             const int* secondDerivativeIndices,
                                                             const int* categoryWeightsIndices,
                                                             const int* stateFrequenciesIndices,
                                                             const int* cumulativeScaleIndices,
                                                             int count,
                                                             double* outSumLogLikelihood,
                                                             double* outSumFirstDerivative,
                                                             double* outSumSecondDerivative) {
    // TODO: implement for count > 1

    if (count == 1) {
        int cumulativeScalingFactorIndex;
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            cumulativeScalingFactorIndex = 0;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            cumulativeScalingFactorIndex = kInternalPartialsBufferCount;
            int child1ScalingIndex = parentBufferIndices[0] - kTipCount;
            int child2ScalingIndex = childBufferIndices[0] - kTipCount;
            resetScaleFactors(cumulativeScalingFactorIndex);
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, cumulativeScalingFactorIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, cumulativeScalingFactorIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, cumulativeScalingFactorIndex);
            }
        } else {
            cumulativeScalingFactorIndex = cumulativeScaleIndices[0];
        }
        if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL)

            if (kAutoRootPartitioningEnabled) {
                calcEdgeLogLikelihoodsByAutoPartitionAsync(parentBufferIndices,
                                                           childBufferIndices,
                                                           probabilityIndices,
                                                           categoryWeightsIndices,
                                                           stateFrequenciesIndices,
                                                           cumulativeScaleIndices,
                                                           gAutoPartitionIndices,
                                                           gAutoPartitionOutSumLogLikelihoods);

                *outSumLogLikelihood = 0.0;

                for (int i = 0; i < kPartitionCount; i++) {
                    *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
                }

                if (*outSumLogLikelihood != *outSumLogLikelihood) {
                    return BEAGLE_ERROR_FLOATING_POINT;
                } else {
                    return BEAGLE_SUCCESS;
                }
            } else {
                return calcEdgeLogLikelihoods(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                       categoryWeightsIndices[0], stateFrequenciesIndices[0], cumulativeScalingFactorIndex,
                                       outSumLogLikelihood);
            }
        else if (secondDerivativeIndices == NULL)
            return calcEdgeLogLikelihoodsFirstDeriv(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                             firstDerivativeIndices[0], categoryWeightsIndices[0], stateFrequenciesIndices[0],
                                             cumulativeScalingFactorIndex, outSumLogLikelihood, outSumFirstDerivative);
        else
            return calcEdgeLogLikelihoodsSecondDeriv(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                              firstDerivativeIndices[0], secondDerivativeIndices[0], categoryWeightsIndices[0],
                                              stateFrequenciesIndices[0], cumulativeScalingFactorIndex, outSumLogLikelihood,
                                              outSumFirstDerivative, outSumSecondDerivative);
    } else {
        if ((kFlags & BEAGLE_FLAG_SCALING_AUTO) || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
            fprintf(stderr,"BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and auto/always scaling\n");
        }

        if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
            return calcEdgeLogLikelihoodsMulti(parentBufferIndices, childBufferIndices, probabilityIndices,
                                          categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, count,
                                          outSumLogLikelihood);
        } else {
            fprintf(stderr,"BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and derivatives\n");
        }
    }
    return BEAGLE_SUCCESS;
}